

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexImageCubeBufferCase::createTexture(TexImageCubeBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *data_00;
  deUint32 seed;
  int iVar5;
  uint uVar6;
  long lVar7;
  deUint32 buf;
  deUint32 tex;
  TransferFormat local_c8;
  deUint32 *local_c0;
  ulong local_b8;
  ulong local_b0;
  TextureFormat *local_a8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  data;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_58;
  
  seed = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                      super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  tex = 0;
  this_01 = &(this->super_TextureCubeSpecCase).m_texFormat;
  local_c8 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  local_a8 = this_01;
  iVar5 = tcu::TextureFormat::getPixelSize(this_01);
  iVar1 = (this->super_TextureCubeSpecCase).m_size;
  iVar4 = this->m_skipPixels + iVar1;
  if (0 < this->m_rowLength) {
    iVar4 = this->m_rowLength;
  }
  iVar2 = this->m_alignment;
  iVar3 = this->m_skipRows;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&data,6,(allocator_type *)&local_58);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_b8 = (ulong)local_c8 >> 0x20;
  uVar6 = -iVar2 & (iVar2 + iVar4 * iVar5) - 1U;
  local_b0 = (ulong)uVar6;
  minVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo;
  maxVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax;
  local_c0 = &s_cubeMapFaces;
  for (lVar7 = 0; lVar7 != 0x90; lVar7 = lVar7 + 0x18) {
    buf = 0;
    randomVector<4>((Functional *)&gMin,&rnd,&minVal->valueMin,maxVal);
    randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&((data.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar7),
               (long)(int)(this->m_offset + (iVar1 + iVar3) * uVar6));
    iVar4 = (this->super_TextureCubeSpecCase).m_size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,local_a8,iVar4,iVar4,1,(int)local_b0,0,
               (void *)((long)this->m_offset + (long)(this->m_skipPixels * iVar5) +
                       (long)(this->m_skipRows * (int)local_b0) +
                       *(long *)((long)&((data.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar7)));
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
    sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
    data_00 = *(void **)((long)&((data.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar7);
    sglr::ContextWrapper::glBufferData
              (this_00,0x88ec,
               (long)(*(int *)((long)&((data.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + lVar7) -
                     (int)data_00),data_00,0x88e4);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
    iVar4 = (this->super_TextureCubeSpecCase).m_size;
    sglr::ContextWrapper::glTexImage2D
              (this_00,*local_c0,0,this->m_internalFormat,iVar4,iVar4,0,local_c8.format,
               (deUint32)local_b8,(void *)(long)this->m_offset);
    local_c0 = local_c0 + 1;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random					rnd			(deStringHash(getName()));
		deUint32					tex			= 0;
		glu::TransferFormat			fmt			= glu::getTransferFormat(m_texFormat);
		const int					pixelSize	= m_texFormat.getPixelSize();
		const int					rowLength	= m_rowLength > 0 ? m_rowLength : m_size + m_skipPixels;
		const int					rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
		const int					height		= m_size + m_skipRows;
		vector<vector<deUint8> >	data		(DE_LENGTH_OF_ARRAY(s_cubeMapFaces));

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			deUint32 buf = 0;

			{
				const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				data[face].resize(rowPitch*height + m_offset);
				tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, rowPitch, 0, &data[face][0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), gMin, gMax);
			}

			// Create buffer and upload.
			glGenBuffers(1, &buf);
			glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
			glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data[face].size(), &data[face][0], GL_STATIC_DRAW);

			glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
			glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
			glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
			glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, fmt.format, fmt.dataType, (const void*)(deUintptr)m_offset);
		}
	}